

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall
mkvmuxer::Chapter::add_string(Chapter *this,char *title,char *language,char *country)

{
  int iVar1;
  bool bVar2;
  Display *this_00;
  char *in_RDI;
  Display *d;
  bool local_1;
  
  bVar2 = ExpandDisplaysArray((Chapter *)language);
  if (bVar2) {
    iVar1 = *(int *)(in_RDI + 0x2c);
    *(int *)(in_RDI + 0x2c) = iVar1 + 1;
    this_00 = (Display *)(*(long *)(in_RDI + 0x20) + (long)iVar1 * 0x18);
    Display::Init(this_00);
    bVar2 = Display::set_title(this_00,in_RDI);
    if (bVar2) {
      bVar2 = Display::set_language(this_00,in_RDI);
      if (bVar2) {
        bVar2 = Display::set_country(this_00,in_RDI);
        if (bVar2) {
          local_1 = true;
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Chapter::add_string(const char* title, const char* language,
                         const char* country) {
  if (!ExpandDisplaysArray())
    return false;

  Display& d = displays_[displays_count_++];
  d.Init();

  if (!d.set_title(title))
    return false;

  if (!d.set_language(language))
    return false;

  if (!d.set_country(country))
    return false;

  return true;
}